

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

void __thiscall
Fl_Text_Buffer::add_modify_callback
          (Fl_Text_Buffer *this,Fl_Text_Modify_Cb bufModifiedCB,void *cbArg)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  Fl_Text_Modify_Cb *pp_Var4;
  void **ppvVar5;
  int local_34;
  int i;
  void **newCBArgs;
  Fl_Text_Modify_Cb *newModifyProcs;
  void *cbArg_local;
  Fl_Text_Modify_Cb bufModifiedCB_local;
  Fl_Text_Buffer *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(this->mNModifyProcs + 1);
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pp_Var4 = (Fl_Text_Modify_Cb *)operator_new__(uVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(this->mNModifyProcs + 1);
  uVar3 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppvVar5 = (void **)operator_new__(uVar3);
  for (local_34 = 0; local_34 < this->mNModifyProcs; local_34 = local_34 + 1) {
    pp_Var4[local_34 + 1] = this->mModifyProcs[local_34];
    ppvVar5[local_34 + 1] = this->mCbArgs[local_34];
  }
  if (this->mNModifyProcs != 0) {
    if (this->mModifyProcs != (Fl_Text_Modify_Cb *)0x0) {
      operator_delete__(this->mModifyProcs);
    }
    if (this->mCbArgs != (void **)0x0) {
      operator_delete__(this->mCbArgs);
    }
  }
  *pp_Var4 = bufModifiedCB;
  *ppvVar5 = cbArg;
  this->mNModifyProcs = this->mNModifyProcs + 1;
  this->mModifyProcs = pp_Var4;
  this->mCbArgs = ppvVar5;
  return;
}

Assistant:

void Fl_Text_Buffer::add_modify_callback(Fl_Text_Modify_Cb bufModifiedCB,
					 void *cbArg)
{
  Fl_Text_Modify_Cb *newModifyProcs =
  new Fl_Text_Modify_Cb[mNModifyProcs + 1];
  void **newCBArgs = new void *[mNModifyProcs + 1];
  for (int i = 0; i < mNModifyProcs; i++) {
    newModifyProcs[i + 1] = mModifyProcs[i];
    newCBArgs[i + 1] = mCbArgs[i];
  }
  if (mNModifyProcs != 0) {
    delete[]mModifyProcs;
    delete[]mCbArgs;
  }
  newModifyProcs[0] = bufModifiedCB;
  newCBArgs[0] = cbArg;
  mNModifyProcs++;
  mModifyProcs = newModifyProcs;
  mCbArgs = newCBArgs;
}